

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcmp32_s.c
# Opt level: O1

errno_t memcmp32_s(uint32_t *dest,rsize_t dmax,uint32_t *src,rsize_t smax,int *diff)

{
  long lVar1;
  long lVar2;
  errno_t error;
  errno_t eVar3;
  char *msg;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (diff == (int *)0x0) {
    msg = "memcmp32_s: diff is null";
LAB_001023d9:
    eVar3 = 400;
    error = 400;
  }
  else {
    *diff = -1;
    if (dest == (uint32_t *)0x0) {
      msg = "memcmp32_s: dest is null";
      goto LAB_001023d9;
    }
    if (src == (uint32_t *)0x0) {
      msg = "memcmp32_s: src is null";
      goto LAB_001023d9;
    }
    if (dmax == 0) {
      msg = "memcmp32_s: dmax is 0";
LAB_00102435:
      eVar3 = 0x191;
      error = 0x191;
    }
    else {
      if (dmax < 0x4000001) {
        if (smax == 0) {
          msg = "memcmp32_s: smax is 0";
          goto LAB_00102435;
        }
        if (smax <= dmax) {
          *diff = 0;
          if (dest == src) {
LAB_0010247c:
            eVar3 = 0;
          }
          else {
            lVar2 = 0;
            do {
              if (dest[lVar2] - src[lVar2] != 0) {
                *diff = dest[lVar2] - src[lVar2];
                goto LAB_0010247c;
              }
              eVar3 = 0;
            } while ((dmax - 1 != lVar2) &&
                    (bVar4 = smax - 1 != lVar2, lVar2 = lVar2 + 1, eVar3 = 0, bVar4));
          }
          goto LAB_001023ea;
        }
        msg = "memcmp32_s: smax exceeds dmax";
      }
      else {
        msg = "memcmp32_s: dmax exceeds max";
      }
      eVar3 = 0x193;
      error = 0x193;
    }
  }
  invoke_safe_mem_constraint_handler(msg,(void *)0x0,error);
LAB_001023ea:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return eVar3;
}

Assistant:

errno_t
memcmp32_s (const uint32_t *dest, rsize_t dmax,
            const uint32_t *src,  rsize_t smax, int *diff)
{
    /*
     * must be able to return the diff
     */
    if (diff == NULL) {
        invoke_safe_mem_constraint_handler("memcmp32_s: diff is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }
    *diff = -1;  /* default diff */


    if (dest == NULL) {
        invoke_safe_mem_constraint_handler("memcmp32_s: dest is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (src == NULL) {
        invoke_safe_mem_constraint_handler("memcmp32_s: src is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (dmax == 0) {
        invoke_safe_mem_constraint_handler("memcmp32_s: dmax is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (dmax > RSIZE_MAX_MEM32) {
        invoke_safe_mem_constraint_handler("memcmp32_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    if (smax == 0) {
        invoke_safe_mem_constraint_handler("memcmp32_s: smax is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (smax > dmax) {
       invoke_safe_mem_constraint_handler("memcmp32_s: smax exceeds dmax",
                  NULL, ESLEMAX);
       return (RCNEGATE(ESLEMAX));
    }

    /*
     * no need to compare the same memory
     */
    if (dest == src) {
        *diff = 0;
        return (RCNEGATE(EOK));
    }

    /*
     * now compare src to dest
     */
    *diff = 0;
    while (dmax != 0 && smax != 0) {
        if (*dest != *src) {
            *diff = *dest - *src;
            break;
        }

        dmax--;
        smax--;

        dest++;
        src++;
    }

    return (RCNEGATE(EOK));
}